

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

Subtree ts_subtree_new_leaf(SubtreePool *pool,TSSymbol symbol,Length padding,Length size,
                           uint32_t lookahead_bytes,TSStateId parse_state,_Bool has_external_tokens,
                           _Bool is_keyword,TSLanguage *language)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  TSPoint TVar7;
  _Bool local_d9;
  ushort uStack_ac;
  undefined2 uStack_aa;
  Subtree *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  TSPoint local_80;
  SubtreeHeapData *data;
  uint32_t local_70;
  undefined8 local_68;
  uint32_t local_60;
  _Bool local_57;
  byte local_56;
  TSSymbolMetadata local_55;
  byte local_54;
  byte local_53;
  ushort local_52;
  _Bool is_inline;
  _Bool extra;
  TSSymbolMetadata metadata;
  _Bool is_keyword_local;
  _Bool has_external_tokens_local;
  SubtreePool *pSStack_50;
  TSSymbol symbol_local;
  SubtreePool *pool_local;
  Length size_local;
  uint32_t local_1c;
  Length padding_local;
  
  local_53 = has_external_tokens;
  local_54 = is_keyword;
  local_52 = symbol;
  pSStack_50 = pool;
  local_55 = ts_language_symbol_metadata(language,symbol);
  local_56 = local_52 == 0;
  local_d9 = false;
  if ((local_52 < 0x100) && (local_d9 = false, (local_53 & 1) == 0)) {
    data = size._0_8_;
    local_70 = size.extent.column;
    local_68 = padding._0_8_;
    local_60 = padding.extent.column;
    local_d9 = ts_subtree_can_inline(padding,size,lookahead_bytes);
  }
  local_57 = local_d9;
  local_1c = padding.bytes;
  if (local_d9 == false) {
    TVar7 = (TSPoint)ts_subtree_pool_allocate(pSStack_50);
    uVar1 = local_52;
    bVar2 = (byte)local_55 & 1;
    bVar3 = (byte)local_55 >> 1;
    bVar4 = local_56 & 1;
    bVar5 = local_53 & 1;
    bVar6 = local_54 & 1;
    local_80 = TVar7;
    memset(&local_a8,0,0x28);
    *(undefined8 *)((long)TVar7 + 0x50) = local_88;
    *(undefined8 *)((long)TVar7 + 0x40) = local_98;
    *(undefined8 *)((long)TVar7 + 0x48) = uStack_90;
    (((anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)((long)TVar7 + 0x30))->field_0).children =
         local_a8;
    *(undefined8 *)((long)TVar7 + 0x38) = uStack_a0;
    *(undefined8 *)((long)TVar7 + 0x20) = 0;
    *(ulong *)((long)TVar7 + 0x28) =
         CONCAT26(uStack_aa,
                  CONCAT24(uStack_ac & 0xfe00 | (ushort)bVar2 | (ushort)(bVar3 & 1) << 1 |
                           (ushort)bVar4 << 2 | (ushort)bVar5 << 6 | (ushort)bVar6 << 8,
                           CONCAT22(parse_state,uVar1)));
    *(SubtreeHeapData **)((long)TVar7 + 0x10) = size._0_8_;
    *(ulong *)((long)TVar7 + 0x18) = CONCAT44(lookahead_bytes,size.extent.column);
    *(ulong *)TVar7 = CONCAT44(local_1c,1);
    *(TSPoint *)((long)TVar7 + 8) = padding.extent;
    padding_local.extent = local_80;
  }
  else {
    bVar2 = (byte)padding_local.extent.row & 0x80;
    padding_local.extent._0_5_ =
         CONCAT14((char)padding.extent.column,
                  CONCAT13((char)size.bytes,
                           CONCAT12((char)padding.bytes,
                                    CONCAT11((char)local_52,
                                             bVar2 | 1 | ((byte)local_55 & 1) << 1 |
                                             ((byte)local_55 >> 1 & 1) << 2 | (local_56 & 1) << 3 |
                                             (local_54 & 1) << 6))));
    padding_local.extent._0_6_ =
         CONCAT15((char)padding.extent.row,padding_local.extent._0_5_) & 0xfffffffffff;
    padding_local.extent.column._1_1_ =
         padding_local.extent.column._1_1_ | (char)lookahead_bytes << 4;
    padding_local.extent.column._2_2_ = parse_state;
  }
  return (Subtree)(SubtreeInlineData)padding_local.extent;
}

Assistant:

Subtree ts_subtree_new_leaf(
  SubtreePool *pool, TSSymbol symbol, Length padding, Length size,
  uint32_t lookahead_bytes, TSStateId parse_state, bool has_external_tokens,
  bool is_keyword, const TSLanguage *language
) {
  TSSymbolMetadata metadata = ts_language_symbol_metadata(language, symbol);
  bool extra = symbol == ts_builtin_sym_end;

  bool is_inline = (
    symbol <= UINT8_MAX &&
    !has_external_tokens &&
    ts_subtree_can_inline(padding, size, lookahead_bytes)
  );

  if (is_inline) {
    return (Subtree) {{
      .parse_state = parse_state,
      .symbol = symbol,
      .padding_bytes = padding.bytes,
      .padding_rows = padding.extent.row,
      .padding_columns = padding.extent.column,
      .size_bytes = size.bytes,
      .lookahead_bytes = lookahead_bytes,
      .visible = metadata.visible,
      .named = metadata.named,
      .extra = extra,
      .has_changes = false,
      .is_missing = false,
      .is_keyword = is_keyword,
      .is_inline = true,
    }};
  } else {
    SubtreeHeapData *data = ts_subtree_pool_allocate(pool);
    *data = (SubtreeHeapData) {
      .ref_count = 1,
      .padding = padding,
      .size = size,
      .lookahead_bytes = lookahead_bytes,
      .error_cost = 0,
      .child_count = 0,
      .symbol = symbol,
      .parse_state = parse_state,
      .visible = metadata.visible,
      .named = metadata.named,
      .extra = extra,
      .fragile_left = false,
      .fragile_right = false,
      .has_changes = false,
      .has_external_tokens = has_external_tokens,
      .is_missing = false,
      .is_keyword = is_keyword,
      .first_leaf = {.symbol = 0, .parse_state = 0},
    };
    return (Subtree) {.ptr = data};
  }
}